

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int xmlEncOutputChunk(xmlCharEncodingHandler *handler,uchar *out,int *outlen,uchar *in,int *inlen)

{
  int local_34;
  int ret;
  int *inlen_local;
  uchar *in_local;
  int *outlen_local;
  uchar *out_local;
  xmlCharEncodingHandler *handler_local;
  
  if (handler->output == (xmlCharEncodingOutputFunc)0x0) {
    if (handler->iconv_out == (iconv_t)0x0) {
      *outlen = 0;
      *inlen = 0;
      local_34 = -4;
    }
    else {
      local_34 = xmlIconvWrapper(handler->iconv_out,out,outlen,in,inlen);
    }
  }
  else {
    local_34 = (*handler->output)(out,outlen,in,inlen);
    if (0 < local_34) {
      local_34 = 0;
    }
  }
  return local_34;
}

Assistant:

static int
xmlEncOutputChunk(xmlCharEncodingHandler *handler, unsigned char *out,
                  int *outlen, const unsigned char *in, int *inlen) {
    int ret;

    if (handler->output != NULL) {
        ret = handler->output(out, outlen, in, inlen);
        if (ret > 0)
           ret = 0;
    }
#ifdef LIBXML_ICONV_ENABLED
    else if (handler->iconv_out != NULL) {
        ret = xmlIconvWrapper(handler->iconv_out, out, outlen, in, inlen);
    }
#endif /* LIBXML_ICONV_ENABLED */
#ifdef LIBXML_ICU_ENABLED
    else if (handler->uconv_out != NULL) {
        ret = xmlUconvWrapper(handler->uconv_out, 0, out, outlen, in, inlen,
                              1);
    }
#endif /* LIBXML_ICU_ENABLED */
    else {
        *outlen = 0;
        *inlen = 0;
        ret = -4;
    }

    return(ret);
}